

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetExecutableNames
          (cmGeneratorTarget *this,string *name,string *realName,string *impName,string *pdbName,
          string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  string prefix;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->Target->IsImportedTarget == true) {
    std::__cxx11::string::string
              ((string *)&prefix,"GetExecutableNames called on imported target: ",(allocator *)&base
              );
    std::__cxx11::string::append((string *)&prefix);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
  }
  std::__cxx11::string::string((string *)&prefix,"VERSION",(allocator *)&base);
  pcVar2 = GetProperty(this,&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  if (this->Target->TargetTypeValue == EXECUTABLE) {
    this_00 = this->Makefile;
    std::__cxx11::string::string((string *)&prefix,"XCODE",(allocator *)&base);
    bVar1 = cmMakefile::IsOn(this_00,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    if (!bVar1) goto LAB_003314ff;
  }
  pcVar2 = (char *)0x0;
LAB_003314ff:
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  base._M_dataplus._M_p = (pointer)&base.field_2;
  base._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  base.field_2._M_local_buf[0] = '\0';
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  suffix.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,config,false,&prefix,&base,&suffix);
  std::operator+(&local_50,&prefix,&base);
  std::operator+(&local_90,&local_50,&suffix);
  std::__cxx11::string::operator=((string *)name,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::_M_assign((string *)realName);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::append((char *)realName);
    std::__cxx11::string::append((char *)realName);
  }
  GetFullNameInternal(&local_90,this,config,true);
  std::__cxx11::string::operator=((string *)impName,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  GetPDBName(&local_90,this,config);
  std::__cxx11::string::operator=((string *)pdbName,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&suffix);
  std::__cxx11::string::~string((string *)&base);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void cmGeneratorTarget::GetExecutableNames(std::string& name,
                                  std::string& realName,
                                  std::string& impName,
                                  std::string& pdbName,
                                  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if(this->IsImported())
    {
    std::string msg =
      "GetExecutableNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(cmake::INTERNAL_ERROR, msg);
    }

  // This versioning is supported only for executables and then only
  // when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char* version = 0;
#else
  // Check for executable version properties.
  const char* version = this->GetProperty("VERSION");
  if(this->GetType() != cmState::EXECUTABLE || this->Makefile->IsOn("XCODE"))
    {
    version = 0;
    }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, false, prefix, base, suffix);

  // The executable name.
  name = prefix+base+suffix;

  // The executable's real name on disk.
#if defined(__CYGWIN__)
  realName = prefix+base;
#else
  realName = name;
#endif
  if(version)
    {
    realName += "-";
    realName += version;
    }
#if defined(__CYGWIN__)
  realName += suffix;
#endif

  // The import library name.
  impName = this->GetFullNameInternal(config, true);

  // The program database file name.
  pdbName = this->GetPDBName(config);
}